

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  ulong uVar1;
  TestEventListeners *this_00;
  StreamingListener *this_01;
  ostream *poVar2;
  GTestLog local_78;
  undefined1 local_71;
  string local_70;
  string local_40;
  long local_20;
  size_t pos;
  string *target;
  UnitTestImpl *this_local;
  
  pos = (size_t)FLAGS_gtest_stream_result_to_abi_cxx11_;
  target = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_20 = std::__cxx11::string::find(-0x60,0x3a);
    if (local_20 == -1) {
      GTestLog::GTestLog(&local_78,GTEST_WARNING,
                         "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/build_O0/tests/googletest-prefix/src/googletest/googletest/src/gtest.cc"
                         ,0x15e9);
      poVar2 = GTestLog::GetStream(&local_78);
      poVar2 = std::operator<<(poVar2,"unrecognized streaming target \"");
      poVar2 = std::operator<<(poVar2,(string *)FLAGS_gtest_stream_result_to_abi_cxx11_);
      std::operator<<(poVar2,"\" ignored.");
      GTestLog::~GTestLog(&local_78);
    }
    else {
      this_00 = listeners(this);
      this_01 = (StreamingListener *)operator_new(0x10);
      local_71 = 1;
      std::__cxx11::string::substr((ulong)&local_40,0x2ee8a0);
      std::__cxx11::string::substr((ulong)&local_70,0x2ee8a0);
      StreamingListener::StreamingListener(this_01,&local_40,&local_70);
      local_71 = 0;
      TestEventListeners::Append(this_00,(TestEventListener *)this_01);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return;
}

Assistant:

void UnitTestImpl::ConfigureStreamingOutput() {
  const std::string& target = GTEST_FLAG(stream_result_to);
  if (!target.empty()) {
    const size_t pos = target.find(':');
    if (pos != std::string::npos) {
      listeners()->Append(new StreamingListener(target.substr(0, pos),
                                                target.substr(pos+1)));
    } else {
      GTEST_LOG_(WARNING) << "unrecognized streaming target \"" << target
                          << "\" ignored.";
    }
  }
}